

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O0

int archive_compressor_bzip2_open(archive_write_filter *f)

{
  int iVar1;
  undefined1 auStack_30 [4];
  int r;
  archive_string as;
  private_data_conflict3 *data;
  archive_write_filter *f_local;
  
  as.buffer_length = (size_t)f->data;
  _auStack_30 = (char *)0x0;
  as.length = 0;
  as.s = (char *)0x0;
  archive_strncat((archive_string *)auStack_30,"bzip2",5);
  if (0 < *(int *)as.buffer_length) {
    archive_strcat((archive_string *)auStack_30," -");
    archive_strappend_char((archive_string *)auStack_30,(char)*(undefined4 *)as.buffer_length + '0')
    ;
  }
  f->write = archive_compressor_bzip2_write;
  iVar1 = __archive_write_program_open
                    (f,*(archive_write_program_data **)(as.buffer_length + 8),_auStack_30);
  archive_string_free((archive_string *)auStack_30);
  return iVar1;
}

Assistant:

static int
archive_compressor_bzip2_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "bzip2");

	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strcat(&as, " -");
		archive_strappend_char(&as, '0' + data->compression_level);
	}
	f->write = archive_compressor_bzip2_write;

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}